

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hh
# Opt level: O2

void __thiscall
tchecker::ts::
lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
::lasso_path_t(lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
               *this,shared_ptr<tchecker::zg::zg_t> *ts)

{
  graph::lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>::
  lasso_path_t(&this->
                super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
              );
  (this->
  super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>).
  super_multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>.
  _vptr_multigraph_t = (_func_int **)&PTR__lasso_path_t_00256e90;
  std::__shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_ts).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>,
             &ts->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

lasso_path_t(std::shared_ptr<TS> const & ts) : _ts(ts) {}